

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraSublimeTextGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,string *make,
          char *makefile,string *target)

{
  string *psVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  undefined1 local_1f8 [8];
  string makefileName_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  allocator<char> local_171;
  string local_170;
  undefined1 local_150 [8];
  string makefileName_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  string makefileName;
  string generator;
  allocator<char> local_32;
  byte local_31;
  string *local_30;
  string *target_local;
  char *makefile_local;
  string *make_local;
  cmExtraSublimeTextGenerator *this_local;
  string *command;
  
  local_31 = 0;
  local_30 = target;
  target_local = (string *)makefile;
  makefile_local = (char *)make;
  make_local = (string *)this;
  this_local = (cmExtraSublimeTextGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"\"",&local_32);
  std::allocator<char>::~allocator(&local_32);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&generator.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)makefile_local
                 ,"\"");
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(string *)(generator.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(generator.field_2._M_local_buf + 8));
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            ((undefined1 *)((long)&makefileName.field_2 + 8));
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&makefileName.field_2 + 8),"NMake Makefiles");
  psVar1 = target_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,(char *)psVar1,&local_c9)
    ;
    cmSystemTools::ConvertToOutputPath((string *)local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"/NOLOGO\", \"/f\", \"");
    std::operator+(&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&makefileName_1.field_2 + 8),", \"",local_30);
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&makefileName_1.field_2 + 8),"\"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)(makefileName_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_a8);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&makefileName.field_2 + 8),"Ninja");
    psVar1 = target_local;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,(char *)psVar1,&local_171);
      cmSystemTools::ConvertToOutputPath((string *)local_150,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"-f\", \"");
      std::operator+(&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                     "\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&makefileName_2.field_2 + 8),", \"",local_30);
      std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&makefileName_2.field_2 + 8),"\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)(makefileName_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_150);
    }
    else {
      std::__cxx11::string::string((string *)local_1f8);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&makefileName.field_2 + 8),"MinGW Makefiles");
      psVar1 = target_local;
      if (bVar2) {
        std::__cxx11::string::operator=((string *)local_1f8,(char *)target_local);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,(char *)psVar1,&local_239);
        cmSystemTools::ConvertToOutputPath(&local_218,&local_238);
        std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator(&local_239);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"-f\", \"");
      std::operator+(&local_260,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     "\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::operator+(&local_2a0,", \"",local_30);
      std::operator+(&local_280,&local_2a0,"\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)local_1f8);
    }
  }
  local_31 = 1;
  std::__cxx11::string::~string((string *)(makefileName.field_2._M_local_buf + 8));
  if ((local_31 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::BuildMakeCommand(
  const std::string& make, const char* makefile, const std::string& target)
{
  std::string command = "\"";
  command += make + "\"";
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "/NOLOGO", "/f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else if (generator == "Ninja") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else {
    std::string makefileName;
    if (generator == "MinGW Makefiles") {
      // no escaping of spaces in this case, see
      // https://gitlab.kitware.com/cmake/cmake/issues/10014
      makefileName = makefile;
    } else {
      makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    }
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  }
  return command;
}